

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeholder.cpp
# Opt level: O3

uint32_t __thiscall
asmjit::CodeHolder::getLabelIdByName
          (CodeHolder *this,char *name,size_t nameLength,uint32_t parentId)

{
  int iVar1;
  ZoneHashNode *__s1;
  uint uVar2;
  ZoneHashNode *pZVar3;
  ulong __n;
  ulong local_30;
  
  local_30 = nameLength;
  anon_unknown_32::CodeHolder_hashNameAndFixLen(name,&local_30);
  if ((local_30 != 0) &&
     (pZVar3 = *(this->_namedLabels).super_ZoneHashBase._data, pZVar3 != (ZoneHashNode *)0x0)) {
    uVar2 = (uint)local_30;
    __n = local_30 & 0xffffffff;
    do {
      if (*(uint *)(pZVar3 + 0x30) == uVar2) {
        if (uVar2 < 0xc) {
          __s1 = pZVar3 + 0x34;
        }
        else {
          __s1 = *(ZoneHashNode **)(pZVar3 + 0x38);
        }
        iVar1 = bcmp(__s1,name,__n);
        if (iVar1 == 0) {
          return *(uint32_t *)(pZVar3 + 0xc);
        }
      }
      pZVar3 = *(ZoneHashNode **)pZVar3;
    } while (pZVar3 != (ZoneHashNode *)0x0);
  }
  return 0;
}

Assistant:

uint32_t CodeHolder::getLabelIdByName(const char* name, size_t nameLength, uint32_t parentId) noexcept {
  uint32_t hVal = CodeHolder_hashNameAndFixLen(name, nameLength);
  if (ASMJIT_UNLIKELY(!nameLength)) return 0;

  LabelEntry* le = _namedLabels.get(LabelByName(name, nameLength, hVal));
  return le ? le->getId() : static_cast<uint32_t>(0);
}